

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

PyObject * libxml_C14NDocDumpMemory(PyObject *self,PyObject *args)

{
  int iVar1;
  xmlNodeSetPtr local_88;
  long *local_80;
  xmlChar **idx;
  undefined8 uStack_70;
  int result;
  xmlChar *doc_txt;
  xmlChar **prefixes;
  xmlNodeSetPtr nodes;
  xmlDocPtr doc;
  PyObject *pPStack_48;
  int with_comments;
  PyObject *pyobj_prefixes;
  PyObject *pPStack_38;
  int exclusive;
  PyObject *pyobj_nodes;
  PyObject *pyobj_doc;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  pyobj_doc = (PyObject *)0x0;
  doc_txt = (xmlChar *)0x0;
  py_retval = args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT
                    (args,"OOiOi:C14NDocDumpMemory",&pyobj_nodes,&stack0xffffffffffffffc8,
                     (long)&pyobj_prefixes + 4,&stack0xffffffffffffffb8,(long)&doc + 4);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    if (pyobj_nodes == (PyObject *)&_Py_NoneStruct) {
      local_88 = (xmlNodeSetPtr)0x0;
    }
    else {
      local_88 = (xmlNodeSetPtr)pyobj_nodes[1].ob_refcnt;
    }
    nodes = local_88;
    if (local_88 == (xmlNodeSetPtr)0x0) {
      PyErr_SetString(_PyExc_TypeError,"bad document.");
      self_local = (PyObject *)0x0;
    }
    else {
      iVar1 = PyxmlNodeSet_Convert(pPStack_38,(xmlNodeSetPtr *)&prefixes);
      if (iVar1 < 0) {
        self_local = (PyObject *)0x0;
      }
      else if ((pyobj_prefixes._4_4_ == 0) ||
              (iVar1 = PystringSet_Convert(pPStack_48,(xmlChar ***)&doc_txt), -1 < iVar1)) {
        iVar1 = xmlC14NDocDumpMemory
                          (nodes,prefixes,pyobj_prefixes._4_4_,doc_txt,doc._4_4_,
                           &stack0xffffffffffffff90);
        if (prefixes != (xmlChar **)0x0) {
          (*_xmlFree)(prefixes[1]);
          (*_xmlFree)(prefixes);
        }
        if (doc_txt != (xmlChar *)0x0) {
          local_80 = (long *)doc_txt;
          while (*local_80 != 0) {
            (*_xmlFree)(*local_80);
            local_80 = local_80 + 1;
          }
          (*_xmlFree)(doc_txt);
        }
        if (iVar1 < 0) {
          PyErr_SetString(_PyExc_Exception,"libxml2 xmlC14NDocDumpMemory failure.");
          self_local = (PyObject *)0x0;
        }
        else {
          pyobj_doc = (PyObject *)PyUnicode_FromStringAndSize(uStack_70,(long)iVar1);
          (*_xmlFree)(uStack_70);
          self_local = pyobj_doc;
        }
      }
      else {
        if (prefixes != (xmlChar **)0x0) {
          (*_xmlFree)(prefixes[1]);
          (*_xmlFree)(prefixes);
        }
        self_local = (PyObject *)0x0;
      }
    }
  }
  return self_local;
}

Assistant:

static PyObject *
libxml_C14NDocDumpMemory(ATTRIBUTE_UNUSED PyObject * self,
                         PyObject * args)
{
    PyObject *py_retval = NULL;

    PyObject *pyobj_doc;
    PyObject *pyobj_nodes;
    int exclusive;
    PyObject *pyobj_prefixes;
    int with_comments;

    xmlDocPtr doc;
    xmlNodeSetPtr nodes;
    xmlChar **prefixes = NULL;
    xmlChar *doc_txt;

    int result;

    if (!PyArg_ParseTuple(args, (char *) "OOiOi:C14NDocDumpMemory",
                          &pyobj_doc,
                          &pyobj_nodes,
                          &exclusive,
                          &pyobj_prefixes,
                          &with_comments))
        return (NULL);

    doc = (xmlDocPtr) PyxmlNode_Get(pyobj_doc);
    if (!doc) {
        PyErr_SetString(PyExc_TypeError, "bad document.");
        return NULL;
    }

    result = PyxmlNodeSet_Convert(pyobj_nodes, &nodes);
    if (result < 0) return NULL;

    if (exclusive) {
        result = PystringSet_Convert(pyobj_prefixes, &prefixes);
        if (result < 0) {
            if (nodes) {
                xmlFree(nodes->nodeTab);
                xmlFree(nodes);
            }
            return NULL;
        }
    }

    result = xmlC14NDocDumpMemory(doc,
                                  nodes,
                                  exclusive,
                                  prefixes,
                                  with_comments,
                                  &doc_txt);

    if (nodes) {
        xmlFree(nodes->nodeTab);
        xmlFree(nodes);
    }
    if (prefixes) {
        xmlChar ** idx = prefixes;
        while (*idx) xmlFree(*(idx++));
        xmlFree(prefixes);
    }

    if (result < 0) {
        PyErr_SetString(PyExc_Exception,
                        "libxml2 xmlC14NDocDumpMemory failure.");
        return NULL;
    }
    else {
        py_retval = PY_IMPORT_STRING_SIZE((const char *) doc_txt,
                                                result);
        xmlFree(doc_txt);
        return py_retval;
    }
}